

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O3

int libtorrent::aux::write_integer<std::back_insert_iterator<std::__cxx11::string>,long,void>
              (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *out,long data)

{
  size_t sVar1;
  string_view sVar2;
  array<char,_21UL> buf;
  array<char,_21UL> local_35;
  
  sVar2 = integer_to_str(&local_35,data);
  if (sVar2._M_len != 0) {
    sVar1 = 0;
    do {
      ::std::__cxx11::string::push_back((char)out->container);
      sVar1 = sVar1 + 1;
    } while (sVar2._M_len != sVar1);
  }
  return (int)sVar2._M_len;
}

Assistant:

int write_integer(OutIt& out, In data)
	{
		entry::integer_type const val = entry::integer_type(data);
		TORRENT_ASSERT(data == In(val));
		// the stack allocated buffer for keeping the
		// decimal representation of the number can
		// not hold number bigger than this:
		static_assert(sizeof(entry::integer_type) <= 8, "64 bit integers required");
		static_assert(sizeof(data) <= sizeof(entry::integer_type), "input data too big, see entry::integer_type");
		std::array<char, 21> buf;
		auto const str = integer_to_str(buf, val);
		for (char const c : str)
		{
			*out = c;
			++out;
		}
		return static_cast<int>(str.size());
	}